

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O1

void tooltip_timeout(void *param_1)

{
  Fl_Window *pFVar1;
  Fl_TooltipBox *this;
  long lVar2;
  
  if (recursion != '\0') {
    return;
  }
  recursion = 1;
  if (((Fl_Tooltip::widget_ == (Fl_Widget *)0x0) ||
      (pFVar1 = Fl_Widget::top_window(Fl_Tooltip::widget_), pFVar1 == (Fl_Window *)0x0)) ||
     (((pFVar1->super_Fl_Group).super_Fl_Widget.flags_ & 2) == 0)) {
    if ((tip == (char *)0x0) || (*tip == '\0')) {
      lVar2 = 0x30;
      if (window == (Fl_TooltipBox *)0x0) goto LAB_001d7d86;
    }
    else {
      if (Fl::grab_ != (Fl_Window *)0x0) goto LAB_001d7d86;
      if (window == (Fl_TooltipBox *)0x0) {
        this = (Fl_TooltipBox *)operator_new(0xf0);
        Fl_TooltipBox::Fl_TooltipBox(this);
        window = this;
      }
      Fl_Widget::label((Fl_Widget *)window,tip);
      Fl_TooltipBox::layout(window);
      Fl_Widget::redraw((Fl_Widget *)window);
      lVar2 = 0x28;
    }
    (**(code **)((long)(window->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                       super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget + lVar2))();
  }
LAB_001d7d86:
  Fl::remove_timeout(recent_timeout,(void *)0x0);
  recursion = 0;
  recent_tooltip = 1;
  return;
}

Assistant:

static void tooltip_timeout(void*) {
#ifdef DEBUG
  puts("tooltip_timeout();");
#endif // DEBUG

  if (recursion) return;
  recursion = 1;
  if (!top_win_iconified_()) {   // no tooltip if top win iconified (STR #3157)
    if (!tip || !*tip) {
      if (window) window->hide();
    } else {
      int condition = 1;
#if !(defined(__APPLE__) || defined(WIN32))
      condition = (Fl::grab() == NULL);
#endif
      if ( condition ) {
	if (!window) window = new Fl_TooltipBox;
	// this cast bypasses the normal Fl_Window label() code:
	((Fl_Widget*)window)->label(tip);
	window->layout();
	window->redraw();
	// printf("tooltip_timeout: Showing window %p with tooltip \"%s\"...\n",
	//        window, tip ? tip : "(null)");
	window->show();
      }
    }
  }

  Fl::remove_timeout(recent_timeout);
  recent_tooltip = 1;
  recursion = 0;
}